

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  char *pcVar1;
  pointer piVar2;
  element_type *peVar3;
  iterator __position;
  size_type sVar4;
  bool bVar5;
  entry_type eVar6;
  int32_t iVar7;
  long lVar8;
  size_type sVar9;
  int32_t iVar10;
  int iVar11;
  _Alloc_hider _Var12;
  uint32_t h;
  string_view w;
  string_view token_00;
  vector<int,_std::allocator<int>_> word_hashes;
  string token;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int *local_88;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  istream *local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_88 = (int *)0x0;
  local_78._M_string_length = 0;
  local_98._M_allocated_capacity = 0;
  local_98._8_8_ = (int *)0x0;
  local_78.field_2._M_local_buf[0] = '\0';
  _Var12._M_p = (pointer)this;
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)labels;
  local_38 = in;
  reset(this,in);
  piVar2 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar2;
  }
  if (*(char **)((long)local_48 + 8) != (char *)local_48->_M_allocated_capacity) {
    *(char **)((long)local_48 + 8) = (char *)local_48->_M_allocated_capacity;
  }
  iVar10 = 0;
  local_40 = words;
  do {
    do {
      bVar5 = readWord((Dictionary *)_Var12._M_p,local_38,&local_78);
      sVar4 = local_78._M_string_length;
      _Var12._M_p = local_78._M_dataplus._M_p;
      if (!bVar5) goto LAB_0012a8b7;
      h = 0x811c9dc5;
      if (local_78._M_string_length != 0) {
        lVar8 = 0;
        do {
          pcVar1 = local_78._M_dataplus._M_p + lVar8;
          lVar8 = lVar8 + 1;
          h = ((int)*pcVar1 ^ h) * 0x1000193;
        } while (local_78._M_string_length != lVar8);
      }
      w._M_str = local_78._M_dataplus._M_p;
      w._M_len = local_78._M_string_length;
      iVar7 = find(this,w,h);
      iVar7 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      if (iVar7 < 0) {
        local_58._M_allocated_capacity = sVar4;
        local_58._8_8_ = _Var12._M_p;
        _Var12._M_p = (pointer)&local_58;
        peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)_Var12._M_p,
                           (peVar3->label)._M_dataplus._M_p,0,(peVar3->label)._M_string_length);
        eVar6 = sVar9 == 0;
      }
      else {
        _Var12._M_p = (pointer)this;
        eVar6 = getType(this,iVar7);
      }
      if (eVar6 == word) {
        token_00._M_str = local_78._M_dataplus._M_p;
        token_00._M_len = local_78._M_string_length;
        _Var12._M_p = (pointer)this;
        addSubwords(this,local_40,token_00,iVar7);
        local_58._M_allocated_capacity._0_4_ = h;
        if ((int *)local_98._8_8_ == local_88) {
          _Var12._M_p = (pointer)&local_98;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_98,(iterator)local_98._8_8_,
                     (int *)local_58._M_local_buf);
        }
        else {
          *(uint32_t *)local_98._8_8_ = h;
          local_98._8_8_ = local_98._8_8_ + 4;
        }
      }
      else if ((-1 < iVar7) && (eVar6 == label)) {
        iVar11 = iVar7 - this->nwords_;
        local_58._M_allocated_capacity._0_4_ = iVar11;
        __position._M_current = *(int **)((long)local_48 + 8);
        _Var12._M_p = (pointer)local_48;
        if (__position._M_current ==
            (int *)((basic_string_view<char,_std::char_traits<char>_> *)
                   (local_48->_M_local_buf + 0x10))->_M_len) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_48,__position,
                     (int *)local_58._M_local_buf);
        }
        else {
          *__position._M_current = iVar11;
          *(int **)((long)local_48 + 8) = __position._M_current + 1;
        }
      }
      iVar10 = iVar10 + 1;
    } while (local_78._M_string_length != DAT_001523a0);
    if (local_78._M_string_length == 0) break;
    _Var12._M_p = local_78._M_dataplus._M_p;
    iVar11 = bcmp(local_78._M_dataplus._M_p,EOS_abi_cxx11_,local_78._M_string_length);
  } while (iVar11 != 0);
LAB_0012a8b7:
  addWordNgrams(this,local_40,(vector<int,_std::allocator<int>_> *)&local_98,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((void *)local_98._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_98._M_allocated_capacity,(long)local_88 - local_98._0_8_);
  }
  return iVar10;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}